

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

size_type __thiscall google::protobuf::Map<long,_double>::InnerMap::Seed(InnerMap *this)

{
  result_type_conflict rVar1;
  result_type rVar2;
  uint32 lo;
  uint32 hi;
  size_type s;
  uniform_int_distribution<unsigned_long> u;
  knuth_b knuth;
  undefined1 local_13a0 [8];
  random_device rd;
  InnerMap *this_local;
  
  rd.field_0._4992_8_ = this;
  std::random_device::random_device((random_device *)local_13a0);
  rVar1 = std::random_device::operator()((random_device *)local_13a0);
  std::
  shuffle_order_engine<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_256UL>
  ::shuffle_order_engine
            ((shuffle_order_engine<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_256UL>
              *)&u._M_param._M_b,(ulong)rVar1);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)&s);
  rVar2 = std::uniform_int_distribution<unsigned_long>::operator()
                    ((uniform_int_distribution<unsigned_long> *)&s,
                     (shuffle_order_engine<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_256UL>
                      *)&u._M_param._M_b);
  std::random_device::~random_device((random_device *)local_13a0);
  return rVar2;
}

Assistant:

size_type Seed() const {
      // random_device can throw, so avoid it unless we are compiling with
      // exceptions enabled.
#if __cpp_exceptions && LANG_CXX11
      try {
        std::random_device rd;
        std::knuth_b knuth(rd());
        std::uniform_int_distribution<size_type> u;
        return u(knuth);
      } catch (...) { }
#endif
      size_type s = static_cast<size_type>(reinterpret_cast<uintptr_t>(this));
#if defined(__x86_64__) && defined(__GNUC__)
      uint32 hi, lo;
      asm("rdtsc" : "=a" (lo), "=d" (hi));
      s += ((static_cast<uint64>(hi) << 32) | lo);
#endif
      return s;
    }